

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-util.h
# Opt level: O2

string * __thiscall
wabt::operator+[abi_cxx11_(string *__return_storage_ptr__,wabt *this,char *x,string_view y)

{
  wabt *this_00;
  char *in_R9;
  string_view x_00;
  string_view y_00;
  
  this_00 = (wabt *)strlen((char *)this);
  x_00._M_str = x;
  x_00._M_len = (size_t)this;
  y_00._M_str = in_R9;
  y_00._M_len = y._M_len;
  operator+[abi_cxx11_(__return_storage_ptr__,this_00,x_00,y_00);
  return __return_storage_ptr__;
}

Assistant:

inline std::string operator+(const char* x, std::string_view y) {
  return std::string_view(x) + y;
}